

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_CCtx_trace(ZSTD_CCtx *cctx,size_t extraCSize)

{
  ZSTD_Trace local_48;
  
  if (cctx->traceCtx != 0) {
    local_48.streaming = 1;
    if ((cctx->inBuffSize == 0) && (cctx->outBuffSize == 0)) {
      local_48.streaming = (uint)(0 < (cctx->appliedParams).nbWorkers);
    }
    local_48.dctx = (ZSTD_DCtx_s *)0x0;
    local_48.version = 0x290a;
    local_48.dictionaryIsCold = 0;
    local_48.dictionaryID = cctx->dictID;
    local_48.dictionarySize = cctx->dictContentSize;
    local_48.uncompressedSize = cctx->consumedSrcSize;
    local_48.compressedSize = extraCSize + cctx->producedCSize;
    local_48.params = &cctx->appliedParams;
    local_48.cctx = cctx;
    duckdb_zstd::ZSTD_trace_compress_end(cctx->traceCtx,&local_48);
  }
  cctx->traceCtx = 0;
  return;
}

Assistant:

void ZSTD_CCtx_trace(ZSTD_CCtx* cctx, size_t extraCSize)
{
#if ZSTD_TRACE
    if (cctx->traceCtx && ZSTD_trace_compress_end != NULL) {
        int const streaming = cctx->inBuffSize > 0 || cctx->outBuffSize > 0 || cctx->appliedParams.nbWorkers > 0;
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        trace.dictionaryID = cctx->dictID;
        trace.dictionarySize = cctx->dictContentSize;
        trace.uncompressedSize = cctx->consumedSrcSize;
        trace.compressedSize = cctx->producedCSize + extraCSize;
        trace.params = &cctx->appliedParams;
        trace.cctx = cctx;
        ZSTD_trace_compress_end(cctx->traceCtx, &trace);
    }
    cctx->traceCtx = 0;
#else
    (void)cctx;
    (void)extraCSize;
#endif
}